

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getLastFullLevel(ImageInfo *info)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  IVec3 *baseSize;
  undefined1 local_38 [8];
  IVec3 levelSize;
  int level;
  IVec3 blockPixelSize;
  int levelCount;
  ImageInfo *info_local;
  
  iVar2 = getLevelCount(info);
  dVar3 = ImageInfo::getFormat(info);
  getTexelBlockPixelSize((anon_unknown_0 *)(levelSize.m_data + 2),dVar3);
  for (levelSize.m_data[1] = 0; iVar1 = iVar2, levelSize.m_data[1] < iVar2;
      levelSize.m_data[1] = levelSize.m_data[1] + 1) {
    dVar3 = ImageInfo::getTarget(info);
    baseSize = ImageInfo::getSize(info);
    getLevelSize((anon_unknown_0 *)local_38,dVar3,baseSize,levelSize.m_data[1]);
    iVar4 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_38);
    iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)(levelSize.m_data + 2));
    iVar1 = levelSize.m_data[1];
    if (iVar4 < iVar5) break;
    iVar4 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_38);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)(levelSize.m_data + 2));
    iVar1 = levelSize.m_data[1];
    if (iVar4 < iVar5) break;
    iVar4 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_38);
    iVar5 = tcu::Vector<int,_3>::z((Vector<int,_3> *)(levelSize.m_data + 2));
    iVar1 = levelSize.m_data[1];
    if (iVar4 < iVar5) break;
  }
  info_local._4_4_ = iVar1 + -1;
  return info_local._4_4_;
}

Assistant:

int getLastFullLevel (const ImageInfo& info)
{
	const int	levelCount		= getLevelCount(info);
	const IVec3	blockPixelSize	= getTexelBlockPixelSize(info.getFormat());

	for (int level = 0; level < levelCount; level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), info.getSize(), level);

		if (levelSize.x() < blockPixelSize.x() || levelSize.y() < blockPixelSize.y() || levelSize.z() < blockPixelSize.z())
			return level - 1;
	}

	return levelCount -1;
}